

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::finish(cb_explore *data)

{
  long in_RDI;
  cb_to_cs *c;
  v_array<float> *in_stack_fffffffffffffff0;
  
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_fffffffffffffff0);
  v_array<float>::delete_v(in_stack_fffffffffffffff0);
  (*(code *)PTR_delete_label_0049cd48)(in_RDI + 0x18);
  (*(code *)PTR_delete_label_0049cd48)(in_RDI + 0xc0);
  (*(code *)PTR_delete_label_0049cd48)(in_RDI + 0xe0);
  return;
}

Assistant:

void finish(cb_explore& data)
{
  data.preds.delete_v();
  data.cover_probs.delete_v();
  cb_to_cs& c = data.cbcs;
  COST_SENSITIVE::cs_label.delete_label(&c.pred_scores);
  COST_SENSITIVE::cs_label.delete_label(&data.cs_label);
  COST_SENSITIVE::cs_label.delete_label(&data.second_cs_label);
}